

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

Error __thiscall asmjit::Logger::logBinary(Logger *this,void *data,size_t size)

{
  Error EVar1;
  __off_t extraout_RDX;
  __off_t __length;
  undefined8 uVar2;
  __off_t extraout_RDX_00;
  undefined8 uVar3;
  size_t size_00;
  StringTmp<256UL> sb;
  anon_union_32_4_a21e1b61_for_String_0 local_158;
  char local_138 [264];
  
  local_158._large.data = local_138;
  local_158._large.size = 0;
  local_158._0_8_ = 0x20;
  local_158._large.capacity = 0x107;
  local_138[0] = '\0';
  String::_opString((String *)&local_158._small,1,"db ",3);
  __length = extraout_RDX;
  if (size != 0) {
    do {
      size_00 = 0x10;
      if (size < 0x10) {
        size_00 = size;
      }
      String::truncate((String *)&local_158._small,(char *)0x3,__length);
      String::_opHex((String *)&local_158._small,1,data,size_00,'\0');
      String::_opChar((String *)&local_158._small,1,'\n');
      uVar2 = local_158._0_8_ & 0xff;
      uVar3 = local_158._small.data;
      if (0x1e < (local_158._0_8_ & 0xff)) {
        uVar2 = local_158._large.size;
        uVar3 = local_158._large.data;
      }
      EVar1 = (*this->_vptr_Logger[2])(this,uVar3,uVar2);
      if (EVar1 != 0) goto LAB_0011aceb;
      data = (void *)((long)data + size_00);
      size = size - size_00;
      __length = extraout_RDX_00;
    } while (size != 0);
  }
  EVar1 = 0;
LAB_0011aceb:
  String::reset((String *)&local_158._small);
  return EVar1;
}

Assistant:

Error Logger::logBinary(const void* data, size_t size) noexcept {
  static const char prefix[] = "db ";

  StringTmp<256> sb;
  sb.append(prefix, ASMJIT_ARRAY_SIZE(prefix) - 1);

  size_t i = size;
  const uint8_t* s = static_cast<const uint8_t*>(data);

  while (i) {
    uint32_t n = uint32_t(Support::min<size_t>(i, 16));
    sb.truncate(ASMJIT_ARRAY_SIZE(prefix) - 1);
    sb.appendHex(s, n);
    sb.append('\n');
    ASMJIT_PROPAGATE(log(sb));
    s += n;
    i -= n;
  }

  return kErrorOk;
}